

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,__1,_1,__1,__1> *lhs,Matrix<double,__1,_1,_0,__1,_1> *rhs,
               Matrix<double,__1,_1,_0,__1,_1> *dest,Scalar *alpha)

{
  long lVar1;
  Index cols;
  double *ptr;
  size_t size;
  Index rows;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  ulong uVar2;
  Scalar *pSVar3;
  Index IVar4;
  Scalar resIncr;
  undefined1 *puVar5;
  Scalar SVar6;
  Scalar SVar7;
  double alpha_00;
  undefined1 auStack_1a8 [8];
  Scalar local_1a0;
  Scalar *local_198;
  Index local_190;
  Scalar *local_188;
  Index local_180;
  double *local_178;
  size_t local_170;
  Index local_168;
  double *local_160;
  Scalar *local_158;
  Scalar *local_150;
  double local_148;
  double local_140;
  BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_true> local_138;
  const_blas_data_mapper<double,_long,_0> local_100;
  const_blas_data_mapper<double,_long,_1> local_f0 [2];
  undefined1 local_d0 [8];
  aligned_stack_memory_handler<double> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  gemv_static_vector_if<double,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Matrix<double,__1,_1,_0,__1,_1> *dest_local;
  Matrix<double,__1,_1,_0,__1,_1> *rhs_local;
  Matrix<double,__1,__1,_1,__1,__1> *lhs_local;
  
  puVar5 = auStack_1a8;
  this = &blas_traits<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::extract(lhs)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>;
  this_00 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            blas_traits<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::extract(rhs);
  local_148 = *alpha;
  SVar6 = blas_traits<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::extractScalarFactor(lhs);
  local_140 = local_148 * SVar6;
  SVar7 = blas_traits<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::extractScalarFactor(rhs);
  alpha_00 = local_140 * SVar7;
  uVar2 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
  if (0x1fffffffffffffff < uVar2) {
    throw_std_bad_alloc();
  }
  pSVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                     ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  if (pSVar3 == (Scalar *)0x0) {
    IVar4 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
    if ((ulong)(IVar4 * 8) < 0x20001) {
      IVar4 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
      lVar1 = -(IVar4 * 8 + 0x1eU & 0xfffffffffffffff0);
      puVar5 = auStack_1a8 + lVar1;
      local_158 = (Scalar *)((long)&local_1a0 + lVar1);
    }
    else {
      IVar4 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
      local_158 = (Scalar *)aligned_malloc(IVar4 << 3);
    }
    local_150 = local_158;
  }
  else {
    local_150 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                          ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
    puVar5 = auStack_1a8;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_150;
  *(undefined8 *)(puVar5 + -8) = 0x177d32;
  pSVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                     ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  if (pSVar3 == (Scalar *)0x0) {
    local_160 = (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_160 = (double *)0x0;
  }
  local_178 = local_160;
  *(undefined8 *)(puVar5 + -8) = 0x177d6d;
  local_170 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
  *(undefined8 *)(puVar5 + -8) = 0x177d80;
  IVar4 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_00);
  size = local_170;
  ptr = local_178;
  *(undefined8 *)(puVar5 + -8) = 0x177daa;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d0,ptr,size,0x20000 < (ulong)(IVar4 << 3)
            );
  *(undefined8 *)(puVar5 + -8) = 0x177db6;
  local_168 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::rows(this);
  *(undefined8 *)(puVar5 + -8) = 0x177dcb;
  local_180 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::cols(this);
  *(undefined8 *)(puVar5 + -8) = 0x177de0;
  local_188 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::data(this);
  *(undefined8 *)(puVar5 + -8) = 0x177df5;
  local_190 = Matrix<double,_-1,_-1,_1,_-1,_-1>::outerStride
                        ((Matrix<double,__1,__1,_1,__1,__1> *)this);
  local_f0[0].super_blas_data_mapper<const_double,_long,_1,_0>.m_data = local_188;
  local_100.super_blas_data_mapper<const_double,_long,_0,_0>.m_data =
       (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_100.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = 1;
  local_f0[0].super_blas_data_mapper<const_double,_long,_1,_0>.m_stride = local_190;
  *(undefined8 *)(puVar5 + -8) = 0x177e9c;
  local_198 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                        (&dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  *(undefined8 *)(puVar5 + -8) = 0x177eb9;
  DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::col
            ((ColXpr *)&local_138,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,0);
  *(undefined8 *)(puVar5 + -8) = 0x177ec7;
  resIncr = (Scalar)BlockImpl_dense<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true,_true>::
                    innerStride(&local_138);
  rows = local_168;
  cols = local_180;
  pSVar3 = local_198;
  local_1a0 = resIncr;
  *(undefined8 *)(puVar5 + -8) = 0x177f07;
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
  ::run(rows,cols,local_f0,&local_100,pSVar3,(long)resIncr,alpha_00);
  *(undefined8 *)(puVar5 + -8) = 0x177f15;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d0);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(lhs)
                                  * RhsBlasTraits::extractScalarFactor(rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }